

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.cpp
# Opt level: O1

bool __thiscall
index::equal_word(index *this,wstring *word,wstring *content,size_t begin,size_t size)

{
  size_t __n;
  int iVar1;
  bool bVar2;
  wchar_t *local_30;
  size_t local_28;
  wchar_t local_20 [4];
  
  std::__cxx11::wstring::substr((ulong)&local_30,(ulong)content);
  __n = word->_M_string_length;
  if (__n == local_28) {
    if (__n == 0) {
      bVar2 = true;
    }
    else {
      iVar1 = wmemcmp((word->_M_dataplus)._M_p,local_30,__n);
      bVar2 = iVar1 == 0;
    }
  }
  else {
    bVar2 = false;
  }
  if (local_30 != local_20) {
    operator_delete(local_30);
  }
  return bVar2;
}

Assistant:

bool index::equal_word(const std::wstring& word, const std::wstring& content, std::size_t begin, std::size_t size)
{
    return word == content.substr(begin, size);
}